

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_interface_block_globally(CompilerHLSL *this,SPIRVariable *var)

{
  uint32_t id;
  mapped_type *pmVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_60 [8];
  Bitset old_flags;
  Bitset *flags;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,id);
  pmVar1 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(var->super_IVariant).self);
  old_flags.higher._M_h._M_single_bucket = (__node_base_ptr)&(pmVar1->decoration).decoration_flags;
  Bitset::Bitset((Bitset *)local_60,(Bitset *)old_flags.higher._M_h._M_single_bucket);
  Bitset::reset((Bitset *)old_flags.higher._M_h._M_single_bucket);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x28])(&local_90,this,var);
  CompilerGLSL::statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2]>
            (&this->super_CompilerGLSL,(char (*) [8])"static ",&local_90,(char (*) [2])0x5abb6c);
  ::std::__cxx11::string::~string((string *)&local_90);
  Bitset::operator=((Bitset *)old_flags.higher._M_h._M_single_bucket,(Bitset *)local_60);
  Bitset::~Bitset((Bitset *)local_60);
  return;
}

Assistant:

void CompilerHLSL::emit_interface_block_globally(const SPIRVariable &var)
{
	add_resource_name(var.self);

	// The global copies of I/O variables should not contain interpolation qualifiers.
	// These are emitted inside the interface structs.
	auto &flags = ir.meta[var.self].decoration.decoration_flags;
	auto old_flags = flags;
	flags.reset();
	statement("static ", variable_decl(var), ";");
	flags = old_flags;
}